

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_67::BinaryReaderIR::OnTableCopyExpr(BinaryReaderIR *this)

{
  Result RVar1;
  _Head_base<0UL,_wabt::Expr_*,_false> local_28;
  Expr *local_20;
  
  MakeUnique<wabt::ExprMixin<(wabt::ExprType)41>>();
  local_28._M_head_impl = local_20;
  local_20 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_28);
  if (local_28._M_head_impl != (Expr *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_20 != (Expr *)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnTableCopyExpr() {
  return AppendExpr(MakeUnique<TableCopyExpr>());
}